

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O0

void QCalendarWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QCalendarWidget *this;
  QDate _t1;
  bool bVar1;
  SelectionMode SVar2;
  QMetaType QVar3;
  QDate QVar4;
  QDate in_RCX;
  uint in_EDX;
  int in_ESI;
  QDate in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QCalendarWidget *_t;
  int in_stack_fffffffffffffed8;
  HorizontalHeaderFormat in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QDate in_stack_fffffffffffffee8;
  QCalendarWidgetPrivate *in_stack_fffffffffffffef0;
  QCalendarWidget *in_stack_fffffffffffffef8;
  QCalendarWidget *in_stack_ffffffffffffff00;
  QCalendarWidget *in_stack_ffffffffffffff08;
  SelectionMode *pSVar5;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff10;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff18;
  QDate in_stack_ffffffffffffff28;
  QDate in_stack_ffffffffffffff38;
  QMetaType local_58;
  QMetaType local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffef8 = (QCalendarWidget *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffef8) {
    case (QCalendarWidget *)0x0:
      selectionChanged((QCalendarWidget *)0x521fdb);
      break;
    case (QCalendarWidget *)0x1:
      local_10 = **(undefined8 **)(in_RCX.jd + 8);
      _t1.jd._4_4_ = in_stack_fffffffffffffedc;
      _t1.jd._0_4_ = in_stack_fffffffffffffed8;
      clicked((QCalendarWidget *)0x522009,_t1);
      break;
    case (QCalendarWidget *)0x2:
      local_18 = **(undefined8 **)(in_RCX.jd + 8);
      QVar4.jd._4_4_ = in_stack_fffffffffffffedc;
      QVar4.jd._0_4_ = in_stack_fffffffffffffed8;
      activated((QCalendarWidget *)0x522037,QVar4);
      break;
    case (QCalendarWidget *)0x3:
      currentPageChanged((QCalendarWidget *)0x522062,in_stack_fffffffffffffedc,
                         in_stack_fffffffffffffed8);
      break;
    case (QCalendarWidget *)0x4:
      local_20 = **(undefined8 **)(in_RCX.jd + 8);
      setSelectedDate(in_stack_ffffffffffffff00,in_stack_ffffffffffffff38);
      break;
    case (QCalendarWidget *)0x5:
      local_28 = **(undefined8 **)(in_RCX.jd + 8);
      local_30 = **(undefined8 **)(in_RCX.jd + 0x10);
      setDateRange(in_stack_ffffffffffffff00,in_RCX,in_RDI);
      break;
    case (QCalendarWidget *)0x6:
      setCurrentPage(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (int)in_stack_ffffffffffffff00);
      break;
    case (QCalendarWidget *)0x7:
      setGridVisible((QCalendarWidget *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     SUB41(in_stack_fffffffffffffedc >> 0x18,0));
      break;
    case (QCalendarWidget *)0x8:
      setNavigationBarVisible
                ((QCalendarWidget *)in_stack_fffffffffffffef0,
                 SUB81((ulong)in_stack_fffffffffffffee8.jd >> 0x38,0));
      break;
    case (QCalendarWidget *)0x9:
      showNextMonth((QCalendarWidget *)in_stack_fffffffffffffef0);
      break;
    case (QCalendarWidget *)0xa:
      showPreviousMonth((QCalendarWidget *)in_stack_fffffffffffffef0);
      break;
    case (QCalendarWidget *)0xb:
      showNextYear((QCalendarWidget *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
      ;
      break;
    case (QCalendarWidget *)0xc:
      showPreviousYear((QCalendarWidget *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      break;
    case (QCalendarWidget *)0xd:
      showSelectedDate((QCalendarWidget *)in_stack_fffffffffffffef0);
      break;
    case (QCalendarWidget *)0xe:
      showToday((QCalendarWidget *)in_stack_fffffffffffffef0);
      break;
    case (QCalendarWidget *)0xf:
      d_func((QCalendarWidget *)0x5221b5);
      local_38 = **(undefined8 **)(in_RCX.jd + 8);
      QCalendarWidgetPrivate::_q_slotShowDate
                ((QCalendarWidgetPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffee8);
      break;
    case (QCalendarWidget *)0x10:
      d_func((QCalendarWidget *)0x5221eb);
      local_40 = **(undefined8 **)(in_RCX.jd + 8);
      QCalendarWidgetPrivate::_q_slotChangeDate
                ((QCalendarWidgetPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffee8);
      break;
    case (QCalendarWidget *)0x11:
      d_func((QCalendarWidget *)0x522221);
      local_48 = **(undefined8 **)(in_RCX.jd + 8);
      QCalendarWidgetPrivate::_q_slotChangeDate
                (in_stack_fffffffffffffef0,in_stack_ffffffffffffff28,
                 SUB81((ulong)in_stack_fffffffffffffee8.jd >> 0x38,0));
      break;
    case (QCalendarWidget *)0x12:
      d_func((QCalendarWidget *)0x52226a);
      QCalendarWidgetPrivate::_q_editingFinished
                ((QCalendarWidgetPrivate *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      break;
    case (QCalendarWidget *)0x13:
      d_func((QCalendarWidget *)0x52227e);
      QCalendarWidgetPrivate::_q_prevMonthClicked
                ((QCalendarWidgetPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      break;
    case (QCalendarWidget *)0x14:
      d_func((QCalendarWidget *)0x522292);
      QCalendarWidgetPrivate::_q_nextMonthClicked
                ((QCalendarWidgetPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      break;
    case (QCalendarWidget *)0x15:
      d_func((QCalendarWidget *)0x5222a6);
      QCalendarWidgetPrivate::_q_yearEditingFinished(in_stack_ffffffffffffff18);
      break;
    case (QCalendarWidget *)0x16:
      d_func((QCalendarWidget *)0x5222ba);
      QCalendarWidgetPrivate::_q_yearClicked(in_stack_ffffffffffffff10);
      break;
    case (QCalendarWidget *)0x17:
      d_func((QCalendarWidget *)0x5222ce);
      QCalendarWidgetPrivate::_q_monthChanged
                (in_stack_ffffffffffffff18,(QAction *)in_stack_ffffffffffffff10);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 0x17) {
      if (**(int **)(in_RCX.jd + 8) == 0) {
        QVar3 = QMetaType::fromType<QAction*>();
        **(undefined8 **)in_RCX.jd = QVar3.d_ptr;
      }
      else {
        memset(&local_58,0,8);
        QMetaType::QMetaType(&local_58);
        **(undefined8 **)in_RCX.jd = local_58.d_ptr;
      }
    }
    else {
      memset(&local_50,0,8);
      QMetaType::QMetaType(&local_50);
      **(undefined8 **)in_RCX.jd = local_50.d_ptr;
    }
  }
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)()>
                      ((QtMocHelpers *)in_RCX.jd,(void **)selectionChanged,0,0);
    if (bVar1) goto LAB_005227db;
    in_stack_ffffffffffffff38.jd = 0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(QDate)>
                      ((QtMocHelpers *)in_RCX.jd,(void **)clicked,0,1);
    if (((bVar1) ||
        (bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(QDate)>
                           ((QtMocHelpers *)in_RCX.jd,(void **)activated,0,2), bVar1)) ||
       (bVar1 = QtMocHelpers::indexOfMethod<void(QCalendarWidget::*)(int,int)>
                          ((QtMocHelpers *)in_RCX.jd,(void **)currentPageChanged,0,3), bVar1))
    goto LAB_005227db;
  }
  if (in_ESI == 1) {
    pSVar5 = *(SelectionMode **)in_RCX.jd;
    in_stack_fffffffffffffef0 = (QCalendarWidgetPrivate *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffef0) {
    case (QCalendarWidgetPrivate *)0x0:
      QVar4 = selectedDate((QCalendarWidget *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(qint64 *)pSVar5 = QVar4.jd;
      break;
    case (QCalendarWidgetPrivate *)0x1:
      QVar4 = minimumDate((QCalendarWidget *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(qint64 *)pSVar5 = QVar4.jd;
      break;
    case (QCalendarWidgetPrivate *)0x2:
      QVar4 = maximumDate((QCalendarWidget *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(qint64 *)pSVar5 = QVar4.jd;
      break;
    case (QCalendarWidgetPrivate *)0x3:
      SVar2 = firstDayOfWeek((QCalendarWidget *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *pSVar5 = SVar2;
      break;
    case (QCalendarWidgetPrivate *)0x4:
      bVar1 = isGridVisible((QCalendarWidget *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(bool *)pSVar5 = bVar1;
      break;
    case (QCalendarWidgetPrivate *)0x5:
      SVar2 = selectionMode((QCalendarWidget *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *pSVar5 = SVar2;
      break;
    case (QCalendarWidgetPrivate *)0x6:
      SVar2 = horizontalHeaderFormat
                        ((QCalendarWidget *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *pSVar5 = SVar2;
      break;
    case (QCalendarWidgetPrivate *)0x7:
      SVar2 = verticalHeaderFormat((QCalendarWidget *)in_stack_fffffffffffffee8.jd);
      *pSVar5 = SVar2;
      break;
    case (QCalendarWidgetPrivate *)0x8:
      bVar1 = isNavigationBarVisible
                        ((QCalendarWidget *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(bool *)pSVar5 = bVar1;
      break;
    case (QCalendarWidgetPrivate *)0x9:
      bVar1 = isDateEditEnabled((QCalendarWidget *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(bool *)pSVar5 = bVar1;
      break;
    case (QCalendarWidgetPrivate *)0xa:
      SVar2 = dateEditAcceptDelay((QCalendarWidget *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *pSVar5 = SVar2;
    }
  }
  if (in_ESI == 2) {
    this = *(QCalendarWidget **)in_RCX.jd;
    switch(in_EDX) {
    case 0:
      setSelectedDate(this,in_stack_ffffffffffffff38);
      break;
    case 1:
      setMinimumDate(in_stack_fffffffffffffef8,in_stack_ffffffffffffff38);
      break;
    case 2:
      setMaximumDate(in_stack_fffffffffffffef8,in_stack_ffffffffffffff38);
      break;
    case 3:
      setFirstDayOfWeek((QCalendarWidget *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffedc);
      break;
    case 4:
      setGridVisible((QCalendarWidget *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     SUB41(in_stack_fffffffffffffedc >> 0x18,0));
      break;
    case 5:
      setSelectionMode(this,(SelectionMode)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      break;
    case 6:
      setHorizontalHeaderFormat
                ((QCalendarWidget *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc);
      break;
    case 7:
      setVerticalHeaderFormat((QCalendarWidget *)in_stack_fffffffffffffef0,NoVerticalHeader);
      break;
    case 8:
      setNavigationBarVisible((QCalendarWidget *)in_stack_fffffffffffffef0,false);
      break;
    case 9:
      setDateEditEnabled(this,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
      break;
    case 10:
      setDateEditAcceptDelay
                ((QCalendarWidget *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc);
    }
  }
  if (in_ESI == 3) {
    if (in_EDX == 1) {
      clearMinimumDate((QCalendarWidget *)CONCAT44(1,in_stack_fffffffffffffee0));
    }
    else if (in_EDX == 2) {
      clearMaximumDate((QCalendarWidget *)CONCAT44(2,in_stack_fffffffffffffee0));
    }
  }
LAB_005227db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged(); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->currentPageChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->setSelectedDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setDateRange((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDate>>(_a[2]))); break;
        case 6: _t->setCurrentPage((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->setGridVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setNavigationBarVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->showNextMonth(); break;
        case 10: _t->showPreviousMonth(); break;
        case 11: _t->showNextYear(); break;
        case 12: _t->showPreviousYear(); break;
        case 13: _t->showSelectedDate(); break;
        case 14: _t->showToday(); break;
        case 15: _t->d_func()->_q_slotShowDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 16: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 17: _t->d_func()->_q_slotChangeDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 18: _t->d_func()->_q_editingFinished(); break;
        case 19: _t->d_func()->_q_prevMonthClicked(); break;
        case 20: _t->d_func()->_q_nextMonthClicked(); break;
        case 21: _t->d_func()->_q_yearEditingFinished(); break;
        case 22: _t->d_func()->_q_yearClicked(); break;
        case 23: _t->d_func()->_q_monthChanged((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)()>(_a, &QCalendarWidget::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(QDate )>(_a, &QCalendarWidget::activated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarWidget::*)(int , int )>(_a, &QCalendarWidget::currentPageChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->selectedDate(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 2: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 3: *reinterpret_cast<Qt::DayOfWeek*>(_v) = _t->firstDayOfWeek(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isGridVisible(); break;
        case 5: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 6: *reinterpret_cast<HorizontalHeaderFormat*>(_v) = _t->horizontalHeaderFormat(); break;
        case 7: *reinterpret_cast<VerticalHeaderFormat*>(_v) = _t->verticalHeaderFormat(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isNavigationBarVisible(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isDateEditEnabled(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->dateEditAcceptDelay(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSelectedDate(*reinterpret_cast<QDate*>(_v)); break;
        case 1: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 3: _t->setFirstDayOfWeek(*reinterpret_cast<Qt::DayOfWeek*>(_v)); break;
        case 4: _t->setGridVisible(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 6: _t->setHorizontalHeaderFormat(*reinterpret_cast<HorizontalHeaderFormat*>(_v)); break;
        case 7: _t->setVerticalHeaderFormat(*reinterpret_cast<VerticalHeaderFormat*>(_v)); break;
        case 8: _t->setNavigationBarVisible(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setDateEditEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setDateEditAcceptDelay(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->clearMinimumDate(); break;
        case 2: _t->clearMaximumDate(); break;
        default: break;
        }
    }
}